

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_gDay(void)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  void *pvVar9;
  Status SVar10;
  int iVar11;
  Status myStatus;
  StrX local_110;
  char iv_3 [5];
  char iv_1 [7];
  char v_3 [6];
  char iv_2 [9];
  char v_2 [12];
  char v_1 [19];
  ulong local_a8;
  ulong local_80;
  ulong local_58;
  int iVar12;
  
  builtin_strncpy(v_1,"   ---31+01:30   \n",0x13);
  builtin_strncpy(v_2,"---01-01:30",0xc);
  builtin_strncpy(v_3,"---28",6);
  builtin_strncpy(iv_1,"---+31",7);
  builtin_strncpy(iv_2,"---28.00",9);
  builtin_strncpy(iv_3,"--31",5);
  myStatus = st_Init;
  StrX::StrX(&local_110,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fa,v_1,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fb,v_2,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10fc,v_3,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x10ff,iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00123518;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x10ff,iv_1,local_110.fLocalForm,0);
LAB_00123518:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1100,iv_2,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_001235f6;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1100,iv_2,local_110.fLocalForm,0);
LAB_001235f6:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_001236da;
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    pcVar1 = local_110.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1101,iv_3,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1101,iv_3,local_110.fLocalForm,0);
  }
  StrX::~StrX(&local_110);
  errSeen = 1;
LAB_001236da:
  iVar12 = 2;
  while (iVar11 = iVar12 + -1, iVar12 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_110,v_1);
    pvVar9 = (void *)0xc;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111b,v_1);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gDay,*pXVar4,
                                 (XSValue_Data)ZEXT2440(CONCAT816(0x1e,CONCAT88(0,local_58))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,v_2);
    pvVar9 = (void *)0xc;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111c,v_2);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gDay,*pXVar4,
                                 (XSValue_Data)ZEXT2440(CONCAT816(1,CONCAT88(0,local_80))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,v_3);
    pvVar9 = (void *)0xc;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x111d,v_3);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      bVar3 = compareActualValue(dt_gDay,*pXVar4,
                                 (XSValue_Data)ZEXT2440(CONCAT816(0x1c,CONCAT88(0,local_a8))));
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1120,iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar9 = (void *)0x1120;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1120,iv_1);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1121,iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar9 = (void *)0x1121;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1121,iv_2);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_110,iv_3);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    iVar12 = iVar11;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        pcVar1 = local_110.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1122,iv_3,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pvVar9 = (void *)0x1122;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1122,iv_3);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar12 = 2;
LAB_00123d3b:
  iVar11 = iVar12 + -1;
  if (iVar12 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x113e,v_1,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_00123e33;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x113e,v_1);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00123e33:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x113f,v_2,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_00123f29;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x113f,v_2);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00123f29:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,v_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1140,v_3,pcVar1,"st_NoCanRep",pcVar6);
      StrX::~StrX(&local_110);
      goto LAB_00124016;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1140,v_3);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00124016:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1144,iv_1,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_110);
      goto LAB_0012411b;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1144,iv_1);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_0012411b:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) {
    SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
    if (SVar10 != myStatus) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
      pcVar1 = local_110.fLocalForm;
      pcVar6 = getStatusString(SVar10);
      pcVar8 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1146,iv_2,pcVar1,pcVar6,pcVar8);
      StrX::~StrX(&local_110);
      goto LAB_00124229;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x1146,iv_2);
    StrX::~StrX(&local_110);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00124229:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_110,iv_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_110.fUnicodeForm,dt_gDay,&myStatus,ver_10,iVar12 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (lVar7 == 0) goto LAB_001242c5;
  StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x1148,iv_3);
  StrX::~StrX(&local_110);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
  goto LAB_0012432e;
LAB_001242c5:
  SVar10 = (uint)(iVar12 == 2) * 4 + st_NoCanRep;
  iVar12 = iVar11;
  if (SVar10 != myStatus) {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
    pcVar1 = local_110.fLocalForm;
    pcVar6 = getStatusString(SVar10);
    pcVar8 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x1148,iv_3,pcVar1,pcVar6,pcVar8);
    StrX::~StrX(&local_110);
LAB_0012432e:
    errSeen = 1;
    iVar12 = iVar11;
  }
  goto LAB_00123d3b;
}

Assistant:

void test_dt_gDay()
{
    const XSValue::DataType dt = XSValue::dt_gDay;
    bool  toValidate = true;

    const char v_1[]="   ---31+01:30   \n";
    const char v_2[]="---01-01:30";
    const char v_3[]="---28";

    const char iv_1[]="---+31";
    const char iv_2[]="---28.00";
    const char iv_3[]="--31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 0;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 28;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_2);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_3);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}